

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  size_t sVar7;
  string *input_stream;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  vector<double,_std::allocator<double>_> coefficients;
  int num_target_order;
  int num_source_order;
  int num_mixture;
  vector<double,_std::allocator<double>_> weights;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  source_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  vector<double,_std::allocator<double>_> coefficients_1;
  double magic_number;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  target_vectors;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  ostringstream error_message;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  option long_options [2];
  int local_53c;
  string local_538;
  int local_514;
  int local_510;
  int local_50c;
  ulong local_508;
  allocator local_4fa;
  allocator local_4f9;
  char *local_4f8;
  vector<double,_std::allocator<double>_> local_4f0;
  vector<double,_std::allocator<double>_> local_4d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_4b8;
  undefined1 local_498 [8];
  double *pdStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488 [6];
  ios_base local_428 [24];
  bool local_410;
  undefined8 local_320;
  ulong local_318;
  double local_310;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_308;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_2f0;
  string local_2d8;
  uint auStack_2b8 [20];
  ios_base local_268 [408];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d0;
  string local_b8;
  string local_98;
  option local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_510 = 0x19;
  local_514 = 0x19;
  local_50c = 0x10;
  local_4b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_320 = 0;
  local_310 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.flag = (int *)0x0;
  local_78.val = 1000;
  local_78._28_4_ = 0;
  local_78.name = "magic";
  local_78.has_arg = 1;
  local_78._12_4_ = 0;
  local_508 = 0;
  local_318 = 0;
  local_4f8 = (char *)0x0;
  local_53c = 0;
  do {
    iVar5 = ya_getopt_long_only(argc,argv,"l:m:L:M:k:fd:D:r:h",&local_78,(int *)0x0);
    if (iVar5 < 0x4d) {
      if (iVar5 == -1) {
        iVar5 = 2;
      }
      else {
        if (iVar5 == 0x44) {
          if ((local_508 & 1) == 0) {
            std::ifstream::ifstream(&local_2d8);
            std::ifstream::open((char *)&local_2d8,(_Ios_Openmode)ya_optarg);
            uVar10 = *(uint *)((long)auStack_2b8 + *(long *)(local_2d8._M_dataplus._M_p + -0x18));
            if ((uVar10 & 5) == 0) {
              local_498 = (undefined1  [8])0x0;
              pdStack_490 = (double *)0x0;
              local_488[0]._M_allocated_capacity = (double *)0x0;
              while (bVar2 = sptk::ReadStream<double>((double *)&local_538,(istream *)&local_2d8),
                    bVar2) {
                if (pdStack_490 == (double *)local_488[0]._0_8_) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)local_498,
                             (iterator)pdStack_490,(double *)&local_538);
                }
                else {
                  *pdStack_490 = (double)local_538._M_dataplus._M_p;
                  pdStack_490 = pdStack_490 + 1;
                }
              }
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::push_back(&local_4b8,(value_type *)local_498);
              if (local_498 != (undefined1  [8])0x0) {
                operator_delete((void *)local_498);
              }
              iVar5 = 4;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_498,"Cannot open file ",0x11);
              pcVar9 = ya_optarg;
              if (ya_optarg == (char *)0x0) {
                std::ios::clear((int)&stack0xfffffffffffffaa8 +
                                (int)*(undefined8 *)((long)local_498 + -0x18) + 0xc0);
              }
              else {
                sVar7 = strlen(ya_optarg);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,pcVar9,sVar7);
              }
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
              sptk::PrintErrorMessage(&local_538,(ostringstream *)local_498);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) {
                operator_delete(local_538._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
              std::ios_base::~ios_base(local_428);
              iVar5 = 1;
              local_53c = 1;
            }
            std::ifstream::~ifstream(&local_2d8);
            if ((uVar10 & 5) == 0) goto LAB_0010403f;
            goto LAB_00104370;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d8,"-D and -r options cannot be specified at the same time",
                     0x36);
          local_498 = (undefined1  [8])local_488;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
          sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        }
        else {
          if (iVar5 != 0x4c) goto switchD_00103bdf_caseD_1;
          std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
          bVar4 = sptk::ConvertStringToInteger(&local_2d8,&local_514);
          bVar2 = 0 < local_514;
          paVar6 = &local_2d8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != paVar6) {
            operator_delete(local_2d8._M_dataplus._M_p);
            paVar6 = extraout_RAX;
          }
          if (bVar4 && bVar2) {
            local_514 = local_514 + -1;
            goto LAB_00104038;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d8,
                     "The argument for the -L option must be a positive integer",0x39);
          local_498 = (undefined1  [8])local_488;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
          sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        }
LAB_0010432c:
        if (local_498 != (undefined1  [8])local_488) {
          operator_delete((void *)local_498);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
        std::ios_base::~ios_base(local_268);
        iVar5 = 1;
        local_53c = 1;
      }
      goto LAB_00104370;
    }
    uVar12 = (ulong)(iVar5 - 100U);
    if (0xe < iVar5 - 100U) {
      if (iVar5 == 0x4d) {
        std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
        bVar2 = sptk::ConvertStringToInteger(&local_2d8,&local_514);
        bVar4 = local_514 < 0;
        paVar6 = &local_2d8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != paVar6) {
          operator_delete(local_2d8._M_dataplus._M_p);
          paVar6 = extraout_RAX_01;
        }
        if (!bVar2 || bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d8,"The argument for the -M option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d8,"non-negative integer",0x14);
          local_498 = (undefined1  [8])local_488;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
          sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
          goto LAB_0010432c;
        }
LAB_00104038:
        local_4f8 = (char *)CONCAT71((int7)((ulong)paVar6 >> 8),1);
      }
      else {
        if (iVar5 != 1000) goto switchD_00103bdf_caseD_1;
        std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
        bVar2 = sptk::ConvertStringToDouble(&local_2d8,&local_310);
        paVar6 = &local_2d8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != paVar6) {
          operator_delete(local_2d8._M_dataplus._M_p);
          paVar6 = extraout_RAX_00;
        }
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d8,"The argument for the -magic option must be a number",
                     0x33);
          local_498 = (undefined1  [8])local_488;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
          sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
          goto LAB_0010432c;
        }
        local_320 = CONCAT71((int7)((ulong)paVar6 >> 8),1);
      }
      goto LAB_0010403f;
    }
    switch(uVar12) {
    case 0:
      if ((local_508 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"-d and -r options cannot be specified at the same time",
                   0x36);
        local_498 = (undefined1  [8])local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
        sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        goto LAB_0010432c;
      }
      local_538._M_dataplus._M_p = (pointer)0x0;
      local_538._M_string_length = 0;
      local_538.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToDouble(&local_2d8,(double *)&local_4f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (bVar2) {
        if (local_538._M_string_length == local_538.field_2._M_allocated_capacity) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_538,
                     (iterator)local_538._M_string_length,(double *)&local_4f0);
        }
        else {
          *(ulong *)local_538._M_string_length =
               CONCAT44(local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
          local_538._M_string_length = local_538._M_string_length + 8;
        }
        while( true ) {
          if (ya_optind < argc) {
            std::__cxx11::string::string((string *)&local_98,argv[ya_optind],&local_4f9);
            bVar4 = sptk::ConvertStringToDouble(&local_98,(double *)&local_4f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
          }
          else {
            bVar4 = false;
          }
          if (bVar4 == false) break;
          if (local_538._M_string_length == local_538.field_2._M_allocated_capacity) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_538,
                       (iterator)local_538._M_string_length,(double *)&local_4f0);
          }
          else {
            *(ulong *)local_538._M_string_length =
                 CONCAT44(local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start);
            local_538._M_string_length = local_538._M_string_length + 8;
          }
          ya_optind = ya_optind + 1;
        }
        iVar5 = 4;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&local_4b8,(value_type *)&local_538);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"The argument for the -d option must be numeric",0x2e);
        local_498 = (undefined1  [8])local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
        sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        if (local_498 != (undefined1  [8])local_488) {
          operator_delete((void *)local_498);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
        std::ios_base::~ios_base(local_268);
        iVar5 = 1;
        local_53c = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_538._M_dataplus._M_p);
      }
      if (bVar2) goto LAB_0010403f;
      break;
    default:
switchD_00103bdf_caseD_1:
      iVar5 = 1;
      anon_unknown.dwarf_4a1f::PrintUsage((ostream *)&std::cerr);
      local_53c = 1;
      break;
    case 2:
      local_318 = CONCAT71((int7)((ulong)((long)&switchD_00103bdf::switchdataD_00117020 +
                                         (long)(int)(&switchD_00103bdf::switchdataD_00117020)
                                                    [uVar12]) >> 8),1);
      goto LAB_0010403f;
    case 4:
      anon_unknown.dwarf_4a1f::PrintUsage((ostream *)&std::cout);
      local_53c = 0;
      iVar5 = 1;
      break;
    case 7:
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
      bVar4 = sptk::ConvertStringToInteger(&local_2d8,&local_50c);
      bVar2 = local_50c < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (!bVar4 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"The argument for the -k option must be a positive integer"
                   ,0x39);
        local_498 = (undefined1  [8])local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
        sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        goto LAB_0010432c;
      }
      goto LAB_0010403f;
    case 8:
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
      bVar4 = sptk::ConvertStringToInteger(&local_2d8,&local_510);
      bVar2 = local_510 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (!bVar4 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_498 = (undefined1  [8])local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
        sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        goto LAB_0010432c;
      }
      local_510 = local_510 + -1;
      goto LAB_0010403f;
    case 9:
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToInteger(&local_2d8,&local_510);
      bVar4 = local_510 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"non-negative integer",0x14);
        local_498 = (undefined1  [8])local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
        sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        goto LAB_0010432c;
      }
LAB_0010403f:
      iVar5 = 0;
      break;
    case 0xe:
      if ((local_508 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,"-r option cannot be specified multiple times",0x2c);
        local_498 = (undefined1  [8])local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
        sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        goto LAB_0010432c;
      }
      local_538._M_dataplus._M_p = (pointer)0x0;
      local_538._M_string_length = 0;
      local_538.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)&local_2d8,ya_optarg,(allocator *)local_498);
      bVar2 = sptk::ConvertStringToInteger(&local_2d8,(int *)&local_4f0);
      if (bVar2) {
        bVar2 = sptk::ComputeFirstOrderRegressionCoefficients
                          ((int)local_4f0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                           (vector<double,_std::allocator<double>_> *)&local_538);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if (!bVar2) goto LAB_001044bc;
        bVar2 = true;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&local_4b8,(value_type *)&local_538);
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
LAB_001044bc:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2d8,
                   "The argument for the -r option must be positive integer(s)",0x3a);
        local_498 = (undefined1  [8])local_488;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
        sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
        if (local_498 != (undefined1  [8])local_488) {
          operator_delete((void *)local_498);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
        std::ios_base::~ios_base(local_268);
        local_53c = 1;
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_538._M_dataplus._M_p);
      }
      iVar1 = ya_optind;
      iVar5 = 1;
      if (bVar2) {
        if (ya_optind < argc) {
          std::__cxx11::string::string((string *)&local_b8,argv[ya_optind],&local_4fa);
          bVar2 = sptk::ConvertStringToInteger(&local_b8,(int *)&local_4f0);
        }
        else {
          bVar2 = false;
        }
        if ((iVar1 < argc) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (bVar2 != false) {
          local_538._M_dataplus._M_p = (pointer)0x0;
          local_538._M_string_length = 0;
          local_538.field_2._M_allocated_capacity = 0;
          bVar2 = sptk::ComputeSecondOrderRegressionCoefficients
                            ((int)local_4f0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                             (vector<double,_std::allocator<double>_> *)&local_538);
          if (bVar2) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back(&local_4b8,(value_type *)&local_538);
            ya_optind = ya_optind + 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2d8,
                       "The argument for the -r option must be positive integer(s)",0x3a);
            local_498 = (undefined1  [8])local_488;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
            sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
            if (local_498 != (undefined1  [8])local_488) {
              operator_delete((void *)local_498);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
            std::ios_base::~ios_base(local_268);
            local_53c = 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_538._M_dataplus._M_p);
          }
          if (!bVar2) goto LAB_0010486b;
        }
        bVar2 = true;
        iVar5 = 4;
        local_508 = CONCAT71((int7)(uVar12 >> 8),1);
      }
      else {
LAB_0010486b:
        bVar2 = false;
      }
      if (bVar2) goto LAB_0010403f;
    }
LAB_00104370:
  } while (iVar5 == 0);
  if (iVar5 != 2) goto LAB_00105303;
  if (((ulong)local_4f8 & 1) == 0) {
    local_514 = local_510;
  }
  if (argc - ya_optind == 1) {
    lVar14 = (long)argc + -1;
    pcVar9 = (char *)0x0;
LAB_001048d0:
    __s = argv[lVar14];
    bVar2 = sptk::SetBinaryMode();
    if (bVar2) {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_4f0,(long)local_50c,(allocator_type *)&local_2d8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_d0,(long)local_50c,(allocator_type *)&local_2d8);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                (&local_2f0,(long)local_50c,(allocator_type *)&local_2d8);
      std::ifstream::ifstream(&local_2d8);
      std::ifstream::open((char *)&local_2d8,(_Ios_Openmode)__s);
      local_4f8 = pcVar9;
      if ((*(byte *)((long)auStack_2b8 + *(long *)(local_2d8._M_dataplus._M_p + -0x18)) & 5) == 0) {
        bVar2 = local_50c < 1;
        if (0 < local_50c) {
          local_508 = CONCAT44(local_508._4_4_,
                               (local_510 + local_514 + 2) *
                               ((int)((ulong)((long)local_4b8.
                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_4b8.
                                                                                                      
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                -0x55555555 + 1));
          lVar11 = 0;
          lVar13 = 0;
          lVar8 = 0;
          lVar14 = 0;
          do {
            bVar2 = sptk::ReadStream<double>
                              ((double *)
                               (CONCAT44(local_4f0.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,
                                         (int)local_4f0.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start) + lVar8),
                               (istream *)&local_2d8);
            iVar5 = (int)local_508;
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_498,"Failed to load mixture weight",0x1d);
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
              sptk::PrintErrorMessage(&local_538,(ostringstream *)local_498);
              goto LAB_00104d21;
            }
            bVar2 = sptk::ReadStream<double>
                              (false,0,0,(int)local_508,
                               (vector<double,_std::allocator<double>_> *)
                               ((long)&((local_d0.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start + lVar13),
                               (istream *)&local_2d8,(int *)0x0);
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_498,"Failed to load mean vector",0x1a);
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
              sptk::PrintErrorMessage(&local_538,(ostringstream *)local_498);
              goto LAB_00104d21;
            }
            sptk::SymmetricMatrix::Resize
                      ((SymmetricMatrix *)
                       ((long)&(local_2f0.
                                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                       lVar11),iVar5);
            if ((local_318 & 1) == 0) {
              local_4d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_4d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_4d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar2 = sptk::ReadStream<double>
                                (false,0,0,iVar5,&local_4d8,(istream *)&local_2d8,(int *)0x0);
              if (bVar2) {
                sptk::SymmetricMatrix::SetDiagonal
                          ((SymmetricMatrix *)
                           ((long)&(local_2f0.
                                    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                   _vptr_SymmetricMatrix + lVar11),&local_4d8);
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,"Failed to load diagonal covariance vector",0x29);
                local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
                sptk::PrintErrorMessage(&local_538,(ostringstream *)local_498);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_538._M_dataplus._M_p != &local_538.field_2) {
                  operator_delete(local_538._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
                std::ios_base::~ios_base(local_428);
                local_53c = 1;
              }
              if (local_4d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_4d8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (!bVar2) goto LAB_00104d5e;
            }
            else {
              bVar2 = sptk::ReadStream((SymmetricMatrix *)
                                       ((long)&(local_2f0.
                                                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               _vptr_SymmetricMatrix + lVar11),(istream *)&local_2d8
                                      );
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_498,"Failed to load covariance matrix",0x20);
                local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
                sptk::PrintErrorMessage(&local_538,(ostringstream *)local_498);
                goto LAB_00104d21;
              }
            }
            lVar14 = lVar14 + 1;
            lVar8 = lVar8 + 8;
            lVar13 = lVar13 + 0x18;
            lVar11 = lVar11 + 0x40;
            bVar2 = local_50c <= lVar14;
          } while (lVar14 < local_50c);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,"Cannot open file ",0x11);
        if (__s == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffffaa8 +
                          (int)*(undefined8 *)((long)local_498 + -0x18) + 0xc0);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar7);
        }
        local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
        sptk::PrintErrorMessage(&local_538,(ostringstream *)local_498);
LAB_00104d21:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
        std::ios_base::~ios_base(local_428);
        local_53c = 1;
LAB_00104d5e:
        bVar2 = false;
      }
      std::ifstream::~ifstream(&local_2d8);
      if (bVar2) {
        local_4d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_4d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        input_stream = &local_2d8;
        std::ifstream::ifstream(input_stream);
        pcVar9 = local_4f8;
        if ((local_4f8 == (char *)0x0) ||
           (std::ifstream::open((char *)&local_2d8,(_Ios_Openmode)local_4f8),
           (*(byte *)((long)auStack_2b8 + *(long *)(local_2d8._M_dataplus._M_p + -0x18)) & 5) == 0))
        {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            input_stream = (string *)&std::cin;
          }
          uVar12 = (long)local_4b8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_4b8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          iVar5 = local_510 + 1;
          local_498 = (undefined1  [8])0x0;
          pdStack_490 = (double *)0x0;
          local_488[0]._M_allocated_capacity = (double *)0x0;
          while (bVar2 = sptk::ReadStream<double>
                                   (false,0,0,iVar5 * ((int)(uVar12 >> 3) * -0x55555555 + 1),
                                    (value_type *)local_498,(istream *)input_stream,(int *)0x0),
                bVar2) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_4d8,(value_type *)local_498);
          }
          if (local_498 != (undefined1  [8])0x0) {
            operator_delete((void *)local_498);
          }
          bVar2 = true;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_498,"Cannot open file ",0x11);
          sVar7 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar9,sVar7);
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
          sptk::PrintErrorMessage(&local_538,(ostringstream *)local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
          std::ios_base::~ios_base(local_428);
          local_53c = 1;
          bVar2 = false;
        }
        std::ifstream::~ifstream(&local_2d8);
        if (bVar2) {
          local_308.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_308.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_308.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
                    ((GaussianMixtureModelBasedConversion *)local_498,local_510,local_514,&local_4b8
                     ,&local_4f0,&local_d0,&local_2f0,(bool)((byte)local_320 & 1),local_310);
          if (local_410 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2d8,
                       "Failed to initialize GaussianMixtureModelBasedConversion",0x38);
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
            sptk::PrintErrorMessage(&local_538,(ostringstream *)&local_2d8);
LAB_0010509f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
              operator_delete(local_538._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
            std::ios_base::~ios_base(local_268);
            local_53c = 1;
            bVar2 = false;
          }
          else {
            bVar4 = sptk::GaussianMixtureModelBasedConversion::Run
                              ((GaussianMixtureModelBasedConversion *)local_498,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&local_4d8,&local_308);
            bVar2 = true;
            if (!bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2d8,"Failed to perform voice conversion",0x22);
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"vc","");
              sptk::PrintErrorMessage(&local_538,(ostringstream *)&local_2d8);
              goto LAB_0010509f;
            }
          }
          sptk::GaussianMixtureModelBasedConversion::~GaussianMixtureModelBasedConversion
                    ((GaussianMixtureModelBasedConversion *)local_498);
          if (bVar2) {
            uVar10 = (int)((long)local_308.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_308.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
            if (0 < (int)uVar10) {
              uVar12 = (ulong)(uVar10 & 0x7fffffff);
              lVar14 = 0;
              do {
                bVar2 = sptk::WriteStream<double>
                                  (0,local_514 + 1,
                                   (vector<double,_std::allocator<double>_> *)
                                   ((long)&((local_308.
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar14),
                                   (ostream *)&std::cout,(int *)0x0);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_2d8,"Failed to write target vectors",0x1e);
                  local_498 = (undefined1  [8])local_488;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
                  sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
                  if (local_498 != (undefined1  [8])local_488) {
                    operator_delete((void *)local_498);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
                  std::ios_base::~ios_base(local_268);
                  local_53c = 1;
                  goto LAB_001052c0;
                }
                lVar14 = lVar14 + 0x18;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            local_53c = 0;
          }
LAB_001052c0:
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_308);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&local_4d8);
      }
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
                (&local_2f0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_d0);
      if ((void *)CONCAT44(local_4f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (int)local_4f0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_4f0.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,
                                         (int)local_4f0.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start));
      }
      goto LAB_00105303;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2d8,"Cannot set translation mode",0x1b);
    local_498 = (undefined1  [8])local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
    sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
  }
  else {
    if (argc - ya_optind == 2) {
      lVar14 = (long)argc + -2;
      pcVar9 = argv[(long)argc + -1];
      goto LAB_001048d0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2d8,"Just two input files, gmmfile and infile, are required",0x36);
    local_498 = (undefined1  [8])local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"vc","");
    sptk::PrintErrorMessage((string *)local_498,(ostringstream *)&local_2d8);
  }
  if (local_498 != (undefined1  [8])local_488) {
    operator_delete((void *)local_498);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
  std::ios_base::~ios_base(local_268);
  local_53c = 1;
LAB_00105303:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_4b8);
  return local_53c;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_source_order(kDefaultNumOrder);
  int num_target_order(kDefaultNumOrder);
  bool is_num_target_order_specified(false);
  int num_mixture(kDefaultNumMixture);
  bool full_covariance_flag(kDefaultFullCovarianceFlag);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:L:M:k:fd:D:r:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_source_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_target_order;
        is_num_target_order_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_num_target_order_specified = true;
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_mixture) ||
            num_mixture <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        full_covariance_flag = true;
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_num_target_order_specified) {
    num_target_order = num_source_order;
  }

  // Get input file names.
  const char* gmm_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    gmm_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    gmm_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, gmmfile and infile, are required";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  // Load GMM.
  std::vector<double> weights(num_mixture);
  std::vector<std::vector<double> > mean_vectors(num_mixture);
  std::vector<sptk::SymmetricMatrix> covariance_matrices(num_mixture);
  {
    std::ifstream ifs;
    ifs.open(gmm_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << gmm_file;
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + num_target_order + 2));
    for (int k(0); k < num_mixture; ++k) {
      if (!sptk::ReadStream(&(weights[k]), &input_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to load mixture weight";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      if (!sptk::ReadStream(false, 0, 0, read_size, &mean_vectors[k],
                            &input_stream, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to load mean vector";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      covariance_matrices[k].Resize(read_size);
      if (full_covariance_flag) {
        if (!sptk::ReadStream(&covariance_matrices[k], &input_stream)) {
          std::ostringstream error_message;
          error_message << "Failed to load covariance matrix";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
      } else {
        std::vector<double> variance;
        if (!sptk::ReadStream(false, 0, 0, read_size, &variance, &input_stream,
                              NULL)) {
          std::ostringstream error_message;
          error_message << "Failed to load diagonal covariance vector";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        covariance_matrices[k].SetDiagonal(variance);
      }
    }
  }

  // Read input vectors.
  std::vector<std::vector<double> > source_vectors;
  {
    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + 1));
    std::vector<double> tmp;
    while (
        sptk::ReadStream(false, 0, 0, read_size, &tmp, &input_stream, NULL)) {
      source_vectors.push_back(tmp);
    }
  }

  // Perform voice conversion.
  std::vector<std::vector<double> > target_vectors;
  {
    sptk::GaussianMixtureModelBasedConversion conversion(
        num_source_order, num_target_order, window_coefficients, weights,
        mean_vectors, covariance_matrices, is_magic_number_specified,
        magic_number);
    if (!conversion.IsValid()) {
      std::ostringstream error_message;
      error_message
          << "Failed to initialize GaussianMixtureModelBasedConversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    if (!conversion.Run(source_vectors, &target_vectors)) {
      std::ostringstream error_message;
      error_message << "Failed to perform voice conversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
  }

  // Write output vectors.
  {
    const int sequence_length(static_cast<int>(target_vectors.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, num_target_order + 1, target_vectors[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write target vectors";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
  }

  return 0;
}